

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableNT.cpp
# Opt level: O2

Dims * __thiscall adios2::VariableNT::Count(Dims *__return_storage_ptr__,VariableNT *this)

{
  VariableBase *pointer;
  allocator local_db;
  allocator local_da;
  allocator local_d9;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  string local_58;
  string local_38;
  
  pointer = this->m_Variable;
  std::__cxx11::string::string
            ((string *)&local_38,"in call to VariableNT::Count",(allocator *)&local_d8);
  helper::CheckForNullptr<adios2::core::VariableBase>(pointer,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  switch(*(undefined4 *)(this->m_Variable + 0x28)) {
  case 1:
    adios2::core::Variable<signed_char>::Count();
    break;
  case 2:
    adios2::core::Variable<short>::Count();
    break;
  case 3:
    adios2::core::Variable<int>::Count();
    break;
  case 4:
    adios2::core::Variable<long>::Count();
    break;
  case 5:
    adios2::core::Variable<unsigned_char>::Count();
    break;
  case 6:
    adios2::core::Variable<unsigned_short>::Count();
    break;
  case 7:
    adios2::core::Variable<unsigned_int>::Count();
    break;
  case 8:
    adios2::core::Variable<unsigned_long>::Count();
    break;
  case 9:
    adios2::core::Variable<float>::Count();
    break;
  case 10:
    adios2::core::Variable<double>::Count();
    break;
  case 0xb:
    adios2::core::Variable<long_double>::Count();
    break;
  case 0xc:
    adios2::core::Variable<std::complex<float>>::Count();
    break;
  case 0xd:
    adios2::core::Variable<std::complex<double>>::Count();
    break;
  case 0xe:
    adios2::core::Variable<std::__cxx11::string>::Count();
    break;
  case 0xf:
    adios2::core::Variable<char>::Count();
    break;
  case 0x10:
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (__return_storage_ptr__,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(this->m_Variable + 0x88));
    break;
  default:
    std::__cxx11::string::string((string *)&local_d8,"bindings::CXX11",&local_d9);
    std::__cxx11::string::string((string *)&local_58,"VariableNT",&local_da);
    std::__cxx11::string::string((string *)&local_78,"Count",&local_db);
    adios2::ToString_abi_cxx11_((DataType)&local_b8);
    std::operator+(&local_98,"invalid data type ",&local_b8);
    helper::Throw<std::runtime_error>(&local_d8,&local_58,&local_78,&local_98,-1);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_d8);
    (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

Dims VariableNT::Count() const
{
    helper::CheckForNullptr(m_Variable, "in call to VariableNT::Count");
    auto type = m_Variable->m_Type;
#define declare_type(T)                                                                            \
    if (type == helper::GetDataType<T>())                                                          \
    {                                                                                              \
        return reinterpret_cast<core::Variable<T> *>(m_Variable)->Count();                         \
    }
    ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
    else if (type == DataType::Struct)
    {
        return reinterpret_cast<core::VariableStruct *>(m_Variable)->m_Count;
    }
    helper::Throw<std::runtime_error>("bindings::CXX11", "VariableNT", "Count",
                                      "invalid data type " + ToString(type));
    return Dims();
}